

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_sbar.cpp
# Opt level: O0

void __thiscall DBaseStatusBar::DrawLog(DBaseStatusBar *this)

{
  FFont *font;
  DFrameBuffer *pDVar1;
  bool bVar2;
  int iVar3;
  SDWORD SVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  char *string;
  int local_5c;
  int local_44;
  anon_union_4_2_12391d7c_for_PalEntry_0 local_40;
  int i_1;
  int local_38;
  int w;
  int y;
  int x;
  int i;
  int height;
  FBrokenLines *lines;
  int local_18;
  int linelen;
  int hudheight;
  int hudwidth;
  DBaseStatusBar *this_local;
  
  _hudheight = this;
  bVar2 = FString::IsNotEmpty(&this->CPlayer->LogText);
  if (bVar2) {
    iVar3 = active_con_scaletext();
    if (iVar3 == 0) {
      iVar3 = DCanvas::GetWidth((DCanvas *)screen);
      linelen = iVar3 / CleanXfac;
      local_18 = DCanvas::GetHeight((DCanvas *)screen);
      local_18 = local_18 / CleanYfac;
    }
    else {
      iVar3 = DCanvas::GetWidth((DCanvas *)screen);
      iVar5 = active_con_scaletext();
      linelen = iVar3 / iVar5;
      iVar3 = DCanvas::GetHeight((DCanvas *)screen);
      local_18 = active_con_scaletext();
      local_18 = iVar3 / local_18;
    }
    if (linelen < 0x280) {
      SVar4 = ::Scale(linelen,9,10);
      local_5c = SVar4 + -0x28;
    }
    else {
      local_5c = 0x230;
    }
    lines._4_4_ = local_5c;
    _i = V_BreakLines(SmallFont,local_5c,&this->CPlayer->LogText,false);
    x = 0x14;
    y = 0;
    while (pDVar1 = screen, _i[y].Width != -1) {
      iVar3 = FFont::GetHeight(SmallFont);
      x = iVar3 + 1 + x;
      y = y + 1;
    }
    if (lines._4_4_ < 0x230) {
      w = linelen / 0x14;
      local_38 = local_18 / 8;
      i_1 = linelen + w * -2;
    }
    else {
      w = (linelen >> 1) + -300;
      local_38 = (local_18 * 3) / 10 - (x >> 1);
      if (local_38 < 0) {
        local_38 = 0;
      }
      i_1 = 600;
    }
    PalEntry::PalEntry((PalEntry *)&local_40.field_0,0);
    iVar3 = w;
    iVar5 = DCanvas::GetWidth((DCanvas *)screen);
    uVar6 = ::Scale(iVar3,iVar5,linelen);
    iVar3 = local_38;
    iVar5 = DCanvas::GetHeight((DCanvas *)screen);
    uVar7 = ::Scale(iVar3,iVar5,local_18);
    iVar3 = i_1;
    iVar5 = DCanvas::GetWidth((DCanvas *)screen);
    uVar8 = ::Scale(iVar3,iVar5,linelen);
    iVar3 = x;
    iVar5 = DCanvas::GetHeight((DCanvas *)screen);
    uVar9 = ::Scale(iVar3,iVar5,local_18);
    (*(pDVar1->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0xe])
              (0x3f000000,pDVar1,(ulong)local_40.d,(ulong)uVar6,(ulong)uVar7,(ulong)uVar8,
               (ulong)uVar9);
    w = w + 0x14;
    local_38 = local_38 + 10;
    local_44 = 0;
    while (iVar5 = w, iVar3 = local_38, pDVar1 = screen, font = SmallFont, _i[local_44].Width != -1)
    {
      string = FString::operator_cast_to_char_(&_i[local_44].Text);
      DCanvas::DrawText((DCanvas *)pDVar1,font,0xb,iVar5,iVar3,string,0x400013a8,1,0x40001399,
                        linelen,0x4000139a,local_18,0);
      iVar3 = FFont::GetHeight(SmallFont);
      local_38 = iVar3 + 1 + local_38;
      local_44 = local_44 + 1;
    }
    V_FreeBrokenLines(_i);
  }
  return;
}

Assistant:

void DBaseStatusBar::DrawLog ()
{
	int hudwidth, hudheight;

	if (CPlayer->LogText.IsNotEmpty())
	{
		// This uses the same scaling as regular HUD messages
		if (active_con_scaletext() == 0)
		{
			hudwidth = SCREENWIDTH / CleanXfac;
			hudheight = SCREENHEIGHT / CleanYfac;
		}
		else
		{
			hudwidth = SCREENWIDTH / active_con_scaletext();
			hudheight = SCREENHEIGHT / active_con_scaletext();
		}

		int linelen = hudwidth<640? Scale(hudwidth,9,10)-40 : 560;
		FBrokenLines *lines = V_BreakLines (SmallFont, linelen, CPlayer->LogText);
		int height = 20;

		for (int i = 0; lines[i].Width != -1; i++) height += SmallFont->GetHeight () + 1;

		int x,y,w;

		if (linelen<560)
		{
			x=hudwidth/20;
			y=hudheight/8;
			w=hudwidth-2*x;
		}
		else
		{
			x=(hudwidth>>1)-300;
			y=hudheight*3/10-(height>>1);
			if (y<0) y=0;
			w=600;
		}
		screen->Dim(0, 0.5f, Scale(x, SCREENWIDTH, hudwidth), Scale(y, SCREENHEIGHT, hudheight), 
							 Scale(w, SCREENWIDTH, hudwidth), Scale(height, SCREENHEIGHT, hudheight));
		x+=20;
		y+=10;
		for (int i = 0; lines[i].Width != -1; i++)
		{

			screen->DrawText (SmallFont, CR_UNTRANSLATED, x, y, lines[i].Text,
				DTA_KeepRatio, true,
				DTA_VirtualWidth, hudwidth, DTA_VirtualHeight, hudheight, TAG_DONE);
			y += SmallFont->GetHeight ()+1;
		}

		V_FreeBrokenLines (lines);
	}
}